

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::StartTestCase(JunitReporter *this,TestCaseInfo *testInfo)

{
  Stats *pSVar1;
  TestCaseStats local_f0;
  
  pSVar1 = this->m_currentStats;
  TestCaseStats::TestCaseStats(&local_f0,&testInfo->className,&testInfo->name);
  std::
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ::emplace_back<Catch::JunitReporter::TestCaseStats>(&pSVar1->m_testCaseStats,&local_f0);
  TestCaseStats::~TestCaseStats(&local_f0);
  local_f0.m_timeInSeconds =
       (double)((this->m_currentStats->m_testCaseStats).
                super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::
  vector<Catch::JunitReporter::TestCaseStats_const*,std::allocator<Catch::JunitReporter::TestCaseStats_const*>>
  ::emplace_back<Catch::JunitReporter::TestCaseStats_const*>
            ((vector<Catch::JunitReporter::TestCaseStats_const*,std::allocator<Catch::JunitReporter::TestCaseStats_const*>>
              *)&this->m_currentTestCaseStats,(TestCaseStats **)&local_f0);
  return;
}

Assistant:

virtual void StartTestCase( const Catch::TestCaseInfo& testInfo ) {
            m_currentStats->m_testCaseStats.push_back( TestCaseStats( testInfo.className, testInfo.name ) );
            m_currentTestCaseStats.push_back( &m_currentStats->m_testCaseStats.back() );
        }